

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallTargetGenerator::GenerateScriptForConfig
          (cmInstallTargetGenerator *this,ostream *os,string *config,Indent indent)

{
  bool bVar1;
  bool bVar2;
  undefined8 *puVar3;
  cmInstallTargetGenerator *pcVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string literal_args;
  string toDir;
  string dest;
  Files files;
  string local_178;
  _Any_data local_158;
  _Manager_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_140;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  string local_f0;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_b0 [64];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Alloc_hider local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50 [2];
  
  GetFiles((Files *)local_b0,this,config);
  if (local_b0._0_8_ != local_b0._8_8_) {
    GetDestination((string *)local_d0,this,config);
    if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      paStack_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&local_118;
      local_128._M_unused._0_8_ = (undefined8)&DAT_00000001;
      local_118 = (code *)CONCAT71(local_118._1_7_,0x2f);
      local_158._M_unused._M_object = (void *)local_d0._8_8_;
      local_158._8_8_ = local_d0._0_8_;
      local_148 = (_Manager_type)&DAT_00000001;
      local_138 = local_58._M_pi;
      local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_p;
      views._M_len = 3;
      views._M_array = (iterator)&local_158;
      local_128._8_8_ = paStack_140;
      cmCatViews_abi_cxx11_(&local_f0,views);
      std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
    }
    cmInstallGenerator::ConvertToAbsoluteDestination(&local_178,(string *)local_d0);
    local_158._M_unused._M_member_pointer = 1;
    local_148 = (_Manager_type)CONCAT71(local_148._1_7_,0x2f);
    local_128._M_unused._M_object = (void *)local_178._M_string_length;
    local_128._8_8_ = local_178._M_dataplus._M_p;
    local_118 = (code *)&DAT_00000001;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_128;
    local_158._8_8_ = &local_148;
    pcStack_110 = (code *)&local_148;
    cmCatViews_abi_cxx11_(&local_f0,views_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    if ((bool)local_50[1]._4_1_ == false) {
      local_158._8_8_ = 0;
      paStack_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)std::
                       _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_&,_cmScriptGeneratorIndent,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx:86:14)>
                       ::_M_invoke;
      local_148 = std::
                  _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_&,_cmScriptGeneratorIndent,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx:86:14)>
                  ::_M_manager;
      local_158._M_unused._M_object = this;
      cmInstallGenerator::AddTweak
                (os,indent,config,&local_f0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_b0 + 0x18),(TweakMethod *)&local_158);
      if (local_148 != (_Manager_type)0x0) {
        (*local_148)(&local_158,&local_158,__destroy_functor);
      }
    }
    bVar1 = this->ImportLibrary;
    bVar2 = this->Optional;
    local_158._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_148 = (_Manager_type)((ulong)local_148 & 0xffffffffffffff00);
    local_158._M_unused._M_object = &local_148;
    if (local_b0._56_8_ != 0) {
      std::operator+(&local_178," FILES_FROM_DIR \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_b0 + 0x30));
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
      pcVar4 = (cmInstallTargetGenerator *)(puVar3 + 2);
      if ((cmInstallTargetGenerator *)*puVar3 == pcVar4) {
        local_118 = (code *)(pcVar4->super_cmInstallGenerator).super_cmScriptGenerator.
                            _vptr_cmScriptGenerator;
        pcStack_110 = (code *)puVar3[3];
        local_128._M_unused._M_object = (cmInstallTargetGenerator *)&local_118;
      }
      else {
        local_118 = (code *)(pcVar4->super_cmInstallGenerator).super_cmScriptGenerator.
                            _vptr_cmScriptGenerator;
        local_128._M_unused._M_object = (cmInstallTargetGenerator *)*puVar3;
      }
      local_128._8_8_ = puVar3[1];
      *puVar3 = pcVar4;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      std::__cxx11::string::_M_append(local_158._M_pod_data,local_128._M_unused._M_member_pointer);
      if ((cmInstallTargetGenerator *)local_128._M_unused._0_8_ !=
          (cmInstallTargetGenerator *)&local_118) {
        operator_delete(local_128._M_unused._M_object,(ulong)((long)local_118 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
    }
    if ((bool)local_50[1]._5_1_ == true) {
      std::__cxx11::string::append(local_158._M_pod_data);
    }
    cmInstallGenerator::AddInstallRule
              (&this->super_cmInstallGenerator,os,(string *)local_d0,local_50[1]._8_4_,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_b0,(bool)((bVar1 | bVar2) & 1),(this->FilePermissions)._M_dataplus._M_p,
               (char *)0x0,(char *)0x0,(char *)local_158._M_unused._0_8_,indent,(char *)0x0);
    if ((bool)local_50[1]._4_1_ == false) {
      local_128._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      pcStack_110 = std::
                    _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_&,_cmScriptGeneratorIndent,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx:110:14)>
                    ::_M_invoke;
      local_118 = std::
                  _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_&,_cmScriptGeneratorIndent,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx:110:14)>
                  ::_M_manager;
      local_128._M_unused._M_object = this;
      cmInstallGenerator::AddTweak
                (os,indent,config,&local_f0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_b0 + 0x18),(TweakMethod *)&local_128);
      if ((_func_int **)local_118 != (_func_int **)0x0) {
        (*local_118)(&local_128,&local_128,3);
      }
    }
    if ((_Manager_type *)local_158._M_unused._0_8_ != &local_148) {
      operator_delete(local_158._M_unused._M_object,(ulong)(local_148 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._0_8_ != &local_c0) {
      operator_delete((void *)local_d0._0_8_,local_c0._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p != local_50) {
    operator_delete(local_60._M_p,local_50[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._48_8_ != &local_70) {
    operator_delete((void *)local_b0._48_8_,local_70._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_b0 + 0x18));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b0);
  return;
}

Assistant:

void cmInstallTargetGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  // Compute the list of files to install for this target.
  Files files = this->GetFiles(config);

  // Skip this rule if no files are to be installed for the target.
  if (files.From.empty()) {
    return;
  }

  // Compute the effective install destination.
  std::string dest = this->GetDestination(config);
  if (!files.ToDir.empty()) {
    dest = cmStrCat(dest, '/', files.ToDir);
  }

  // Tweak files located in the destination directory.
  std::string toDir = cmStrCat(ConvertToAbsoluteDestination(dest), '/');

  // Add pre-installation tweaks.
  if (!files.NoTweak) {
    AddTweak(os, indent, config, toDir, files.To,
             [this](std::ostream& o, Indent i, const std::string& c,
                    const std::string& f) {
               this->PreReplacementTweaks(o, i, c, f);
             });
  }

  // Write code to install the target file.
  const char* no_dir_permissions = nullptr;
  const char* no_rename = nullptr;
  bool optional = this->Optional || this->ImportLibrary;
  std::string literal_args;
  if (!files.FromDir.empty()) {
    literal_args += " FILES_FROM_DIR \"" + files.FromDir + "\"";
  }
  if (files.UseSourcePermissions) {
    literal_args += " USE_SOURCE_PERMISSIONS";
  }
  this->AddInstallRule(os, dest, files.Type, files.From, optional,
                       this->FilePermissions.c_str(), no_dir_permissions,
                       no_rename, literal_args.c_str(), indent);

  // Add post-installation tweaks.
  if (!files.NoTweak) {
    AddTweak(os, indent, config, toDir, files.To,
             [this](std::ostream& o, Indent i, const std::string& c,
                    const std::string& f) {
               this->PostReplacementTweaks(o, i, c, f);
             });
  }
}